

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O0

bool __thiscall
ithipublisher::PrintNameList
          (ithipublisher *this,FILE *F,
          vector<_metric_name_line,_std::allocator<_metric_name_line>_> *name_list,double mult)

{
  double dVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  bool bVar7;
  ulong local_38;
  size_t i;
  bool ret;
  double mult_local;
  vector<_metric_name_line,_std::allocator<_metric_name_line>_> *name_list_local;
  FILE *F_local;
  ithipublisher *this_local;
  
  bVar3 = true;
  local_38 = 0;
  while( true ) {
    bVar7 = false;
    if (bVar3) {
      sVar5 = std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::size(name_list);
      bVar7 = local_38 < sVar5;
    }
    if (!bVar7) break;
    if (local_38 != 0) {
      iVar4 = fprintf((FILE *)F,",\n");
      bVar3 = 0 < iVar4;
    }
    pvVar6 = std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::operator[]
                       (name_list,local_38);
    pcVar2 = pvVar6->name;
    pvVar6 = std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::operator[]
                       (name_list,local_38);
    dVar1 = pvVar6->current;
    pvVar6 = std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::operator[]
                       (name_list,local_38);
    iVar4 = fprintf((FILE *)F,"[\"%s\", %8f, %8f]",mult * dVar1,mult * pvVar6->average,pcVar2);
    bVar3 = (bool)(bVar3 & 0 < iVar4);
    local_38 = local_38 + 1;
  }
  return bVar3;
}

Assistant:

bool ithipublisher::PrintNameList(FILE * F, std::vector<MetricNameLine>* name_list, double mult)
{
    bool ret = true;

    for (size_t i = 0; ret && i < name_list->size(); i++)
    {
        if (i != 0)
        {
            ret = fprintf(F, ",\n") > 0;
        }
        ret &= (fprintf(F, "[\"%s\", %8f, %8f]", 
            (*name_list)[i].name, mult * (*name_list)[i].current, mult * (*name_list)[i].average) > 0);
    }

    return ret;
}